

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

void __thiscall
MipsOpcodeFormatter::handleOpcodeParameters
          (MipsOpcodeFormatter *this,MipsOpcodeData *opData,MipsRegisterData *regData,
          MipsImmediateData *immData)

{
  char cVar1;
  string *psVar2;
  char *args;
  string local_58;
  MipsImmediateType local_34;
  char *pcStack_30;
  MipsImmediateType type;
  char *encoding;
  MipsImmediateData *immData_local;
  MipsRegisterData *regData_local;
  MipsOpcodeData *opData_local;
  MipsOpcodeFormatter *this_local;
  
  pcStack_30 = (opData->opcode).encoding;
  encoding = (char *)immData;
  immData_local = (MipsImmediateData *)regData;
  regData_local = (MipsRegisterData *)opData;
  opData_local = (MipsOpcodeData *)this;
  while (*pcStack_30 != '\0') {
    args = pcStack_30 + 1;
    switch(*pcStack_30) {
    case 'C':
    case 'W':
      pcStack_30 = args;
      break;
    case 'D':
      pcStack_30 = args;
      psVar2 = Identifier::string_abi_cxx11_((Identifier *)&immData_local[3].primary.expression);
      std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      break;
    default:
      cVar1 = *pcStack_30;
      pcStack_30 = args;
      std::__cxx11::string::operator+=((string *)this,cVar1);
      break;
    case 'S':
      pcStack_30 = args;
      psVar2 = Identifier::string_abi_cxx11_((Identifier *)&immData_local[1].secondary.value);
      std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      break;
    case 'T':
      pcStack_30 = args;
      psVar2 = Identifier::string_abi_cxx11_((Identifier *)&immData_local[2].secondary);
      std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      break;
    case 'V':
      pcStack_30 = pcStack_30 + 2;
      cVar1 = *args;
      if (cVar1 == 'd') {
        psVar2 = Identifier::string_abi_cxx11_((Identifier *)&immData_local[4].secondary.value);
        std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      }
      else if (cVar1 == 's') {
        psVar2 = Identifier::string_abi_cxx11_
                           ((Identifier *)
                            &immData_local[3].secondary.expression.expression.
                             super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      }
      else if (cVar1 == 't') {
        psVar2 = Identifier::string_abi_cxx11_
                           ((Identifier *)&immData_local[4].primary.expression.constExpression);
        std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      }
      break;
    case 'd':
      pcStack_30 = args;
      psVar2 = Identifier::string_abi_cxx11_
                         ((Identifier *)&immData_local[1].primary.expression.constExpression);
      std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      break;
    case 'i':
      pcStack_30 = args;
      decodeImmediateSize(&stack0xffffffffffffffd0,&local_34);
      handleImmediate(this,*(MipsImmediateType *)encoding,*(uint *)(encoding + 0x24),
                      *(uint *)&(regData_local->grs).name._name.field_2);
      break;
    case 'j':
      pcStack_30 = args;
      handleImmediate(this,*(MipsImmediateType *)(encoding + 0x28),*(uint *)(encoding + 0x4c),
                      *(uint *)&(regData_local->grs).name._name.field_2);
      pcStack_30 = pcStack_30 + 1;
      break;
    case 'm':
    case 'v':
      pcStack_30 = pcStack_30 + 2;
      cVar1 = *args;
      if (cVar1 == 'd') {
        psVar2 = Identifier::string_abi_cxx11_
                           ((Identifier *)&immData_local[10].primary.expression.constExpression);
        std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      }
      else if (cVar1 == 's') {
        psVar2 = Identifier::string_abi_cxx11_((Identifier *)&immData_local[9].primary.expression);
        std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      }
      else if (cVar1 == 't') {
        psVar2 = Identifier::string_abi_cxx11_
                           ((Identifier *)
                            &immData_local[9].secondary.expression.expression.
                             super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      }
      break;
    case 'r':
      pcStack_30 = args;
      tinyformat::format<char>(&local_58,"r%d",args);
      std::__cxx11::string::operator+=((string *)this,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      pcStack_30 = pcStack_30 + 1;
      break;
    case 's':
      pcStack_30 = args;
      psVar2 = Identifier::string_abi_cxx11_((Identifier *)&(immData_local->primary).expression);
      std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      break;
    case 't':
      pcStack_30 = args;
      psVar2 = Identifier::string_abi_cxx11_
                         ((Identifier *)
                          &(immData_local->secondary).expression.expression.
                           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      break;
    case 'w':
      pcStack_30 = args;
      std::__cxx11::string::operator+=((string *)this,"wb");
    }
  }
  return;
}

Assistant:

void MipsOpcodeFormatter::handleOpcodeParameters(const MipsOpcodeData& opData, const MipsRegisterData& regData,
	const MipsImmediateData& immData)
{
	const char* encoding = opData.opcode.encoding;

	MipsImmediateType type;
	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'r':	// forced register
			buffer += tfm::format("r%d",*encoding);
			encoding += 1;
			break;
		case 's':	// register
			buffer += regData.grs.name.string();
			break;
		case 'd':	// register
			buffer += regData.grd.name.string();
			break;
		case 't':	// register
			buffer += regData.grt.name.string();
			break;
		case 'S':	// fpu register
			buffer += regData.frs.name.string();
			break;
		case 'D':	// fpu register
			buffer += regData.frd.name.string();
			break;
		case 'T':	// fpu register
			buffer += regData.frt.name.string();
			break;
		case 'v':	// psp vfpu reg
		case 'm':	// vfpu matrix register
			switch (*encoding++)
			{
			case 'd':
				buffer += regData.vrd.name.string();
				break;
			case 's':
				buffer += regData.vrs.name.string();
				break;
			case 't':
				buffer += regData.vrt.name.string();
				break;
			}
			break;
		case 'V':	// ps2 vector reg
			switch (*encoding++)
			{
			case 'd':
				buffer += regData.ps2vrd.name.string();
				break;
			case 's':
				buffer += regData.ps2vrs.name.string();
				break;
			case 't':
				buffer += regData.ps2vrt.name.string();
				break;
			}
			break;
		case 'i':	// primary immediate
			decodeImmediateSize(encoding,type);
			handleImmediate(immData.primary.type,immData.primary.originalValue,opData.opcode.flags);
			break;
		case 'j':	// secondary immediate
			handleImmediate(immData.secondary.type,immData.secondary.originalValue, opData.opcode.flags);
			encoding++;
			break;
		case 'C':	// vfpu condition
		case 'W':	// vfpu argument
			// TODO
			break;
		case 'w':	// 'wb' characters
			buffer += "wb";
			break;
		default:
			buffer += *(encoding-1);
			break;
		}
	}
}